

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall
Lodtalk::StackInterpreter::activateBlockClosure(StackInterpreter *this,BlockClosure *closure)

{
  ulong uVar1;
  uintptr_t uVar2;
  CompiledMethod *pCVar3;
  undefined8 uVar4;
  StackMemory *pSVar5;
  uint8_t *puVar6;
  ObjectHeader OVar7;
  size_t sVar8;
  long lVar9;
  
  uVar1 = (closure->numArgs).field_0.uintValue;
  if ((uVar1 & 1) != 0) {
    uVar2 = (closure->outerContext).field_0.uintValue;
    pCVar3 = *(CompiledMethod **)(uVar2 + 0x20);
    uVar4 = *(undefined8 *)(uVar2 + 0x30);
    pSVar5 = this->stack;
    puVar6 = (pSVar5->stackFrame).stackPointer;
    (pSVar5->stackFrame).stackPointer = puVar6 + -8;
    *(uint8_t **)(puVar6 + -8) = (pSVar5->stackFrame).framePointer;
    pSVar5 = this->stack;
    puVar6 = (pSVar5->stackFrame).stackPointer;
    (pSVar5->stackFrame).framePointer = puVar6;
    (pSVar5->stackFrame).stackPointer = puVar6 + -8;
    *(CompiledMethod **)(puVar6 + -8) = pCVar3;
    this->method = pCVar3;
    pSVar5 = this->stack;
    puVar6 = (pSVar5->stackFrame).stackPointer;
    *(ulong *)(puVar6 + -8) = uVar1 >> 1 & 0xff | 0x100;
    (pSVar5->stackFrame).stackPointer = puVar6 + -0x10;
    *(undefined8 **)(puVar6 + -0x10) = &NilObject;
    puVar6 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar6 + -8;
    *(undefined8 *)(puVar6 + -8) = uVar4;
    sVar8 = ProtoObject::getNumberOfElements((ProtoObject *)closure);
    if (sVar8 != 3) {
      lVar9 = 0;
      do {
        OVar7 = (&closure[1].super_Object)[lVar9].super_ProtoObject.object_header_;
        puVar6 = (this->stack->stackFrame).stackPointer;
        (this->stack->stackFrame).stackPointer = puVar6 + -8;
        *(ObjectHeader *)(puVar6 + -8) = OVar7;
        lVar9 = lVar9 + 1;
      } while (sVar8 - 3 != lVar9);
    }
    VMContext::garbageCollectionSafePoint(this->context);
    fetchFrameData(this);
    uVar1 = (closure->startpc).field_0.intValue;
    if ((uVar1 & 1) != 0) {
      this->pc = (long)uVar1 >> 1;
      checkStackOverflow(this);
      sVar8 = this->pc;
      this->pc = sVar8 + 1;
      this->nextOpcode =
           (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                  super_SequenceableCollection.super_Collection.super_Object.
                                  super_ProtoObject.object_header_ + sVar8);
      return;
    }
  }
  __assert_fail("isSmallInteger()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
}

Assistant:

void pushReceiverVariable(size_t receiverVarIndex)
	{
		auto localVar = getInstanceVariable(receiverVarIndex);
		pushOop(localVar);
	}